

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

Gia_Man_t * Gia_ManUpdateExtraAig(void *pTime,Gia_Man_t *p,Vec_Int_t *vBoxPres)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vOutPres;
  Gia_Man_t *pGVar4;
  int iVar5;
  
  vOutPres = Vec_IntAlloc(100);
  iVar5 = vBoxPres->nSize;
  iVar1 = Tim_ManBoxNum((Tim_Man_t *)pTime);
  if (iVar5 != iVar1) {
    __assert_fail("Vec_IntSize(vBoxPres) == Tim_ManBoxNum(pManTime)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,700,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar5 = p->vCos->nSize;
  iVar1 = Tim_ManCiNum((Tim_Man_t *)pTime);
  iVar2 = Tim_ManPiNum((Tim_Man_t *)pTime);
  if (iVar5 == iVar1 - iVar2) {
    iVar5 = 0;
    iVar1 = 0;
    while( true ) {
      iVar2 = Tim_ManBoxNum((Tim_Man_t *)pTime);
      if (iVar2 <= iVar5) break;
      iVar2 = 0;
      while( true ) {
        iVar3 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar5);
        if (iVar3 <= iVar2) break;
        iVar3 = Vec_IntEntry(vBoxPres,iVar5);
        Vec_IntPush(vOutPres,iVar3);
        iVar2 = iVar2 + 1;
      }
      iVar2 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar5);
      iVar1 = iVar1 + iVar2;
      iVar5 = iVar5 + 1;
    }
    if (iVar1 == p->vCos->nSize) {
      pGVar4 = Gia_ManDupOutputVec(p,vOutPres);
      Vec_IntFree(vOutPres);
      return pGVar4;
    }
    __assert_fail("curPo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0x2c4,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  __assert_fail("Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - Tim_ManPiNum(pManTime)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                ,0x2bd,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManUpdateExtraAig( void * pTime, Gia_Man_t * p, Vec_Int_t * vBoxPres )
{
    Gia_Man_t * pNew;
    Tim_Man_t * pManTime = (Tim_Man_t *)pTime;
    Vec_Int_t * vOutPres = Vec_IntAlloc( 100 );
    int i, k, curPo = 0;
    assert( Vec_IntSize(vBoxPres) == Tim_ManBoxNum(pManTime) );
    assert( Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - Tim_ManPiNum(pManTime) );
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            Vec_IntPush( vOutPres, Vec_IntEntry(vBoxPres, i) );
        curPo += Tim_ManBoxOutputNum(pManTime, i);
    }
    assert( curPo == Gia_ManCoNum(p) );
    pNew = Gia_ManDupOutputVec( p, vOutPres );
    Vec_IntFree( vOutPres );
    return pNew;
}